

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O2

size_t ParseDynamic(void *buf,uint offset,size_t size,uint8_t *block_id)

{
  ulong uVar1;
  char *__format;
  uint uVar2;
  size_t sStack_10;
  
  uVar1 = (ulong)offset;
  if (size < offset + 3) {
    __format = "Inconsistency in the list of dynamic blocks at %d\n";
LAB_00101563:
    fprintf(_stderr,__format,uVar1);
    sStack_10 = 0xffffffffffffffff;
  }
  else {
    uVar2 = (uint)*(byte *)((long)buf + uVar1 + 2) * 2 | (uint)*(byte *)((long)buf + uVar1 + 1) << 9
    ;
    if (uVar2 == 0) {
      if (*(uint8_t *)((long)buf + uVar1) != '\0') {
        __format = "Dynamic block at %d has size 0!\n";
        goto LAB_00101563;
      }
      uVar2 = (int)size - offset;
    }
    *block_id = *(uint8_t *)((long)buf + uVar1);
    sStack_10 = (size_t)uVar2;
  }
  return sStack_10;
}

Assistant:

size_t ParseDynamic(void *buf, unsigned int offset, size_t size, uint8_t *block_id)
{
    DBlockIdHdr_t *dblock = (DBlockIdHdr_t *)((unsigned char *)buf + offset);
    unsigned int next_size;
    if (size < offset + 3) {
        fprintf(stderr, "Inconsistency in the list of dynamic blocks at %d\n", offset);
        return -1;
    }
    next_size = (((unsigned int)(dblock->DBlockLength[0]) << 8) | (unsigned int)(dblock->DBlockLength[1])) << 1;
    if (next_size == 0) {
        if (dblock->DBlockId == EEEP_BLOCK_ID_UNUSED) {
            //  End of data
            next_size = size - offset;
        } else {
            //  Error
            fprintf(stderr, "Dynamic block at %d has size 0!\n", offset);
            return -1;
        }
    }
    *block_id = dblock->DBlockId;
    return next_size;
}